

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON * chaiscript::json::JSONParser::parse_bool
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_type *local_20;
  size_t *offset_local;
  string *str_local;
  
  local_20 = offset;
  offset_local = (size_t *)str;
  str_local = (string *)__return_storage_ptr__;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_40,str,*offset,4);
  bVar1 = std::operator==(&local_40,"true");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    *local_20 = *local_20 + 4;
    JSON::JSON<bool>(__return_storage_ptr__,true,(type *)0x0);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)offset_local,
               *local_20,5);
    bVar1 = std::operator==(&local_60,"false");
    std::__cxx11::string::~string((string *)&local_60);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"JSON ERROR: Bool: Expected \'true\' or \'false\', found \'",
                 &local_c1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)offset_local,
                 *local_20,5);
      std::operator+(&local_a0,&local_c0,&local_f8);
      std::operator+(&local_80,&local_a0,"\'");
      std::runtime_error::runtime_error(this,(string *)&local_80);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *local_20 = *local_20 + 5;
    JSON::JSON<bool>(__return_storage_ptr__,false,(type *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_bool(const std::string &str, size_t &offset) {
      if (str.substr(offset, 4) == "true") {
        offset += 4;
        return JSON(true);
      } else if (str.substr(offset, 5) == "false") {
        offset += 5;
        return JSON(false);
      } else {
        throw std::runtime_error(std::string("JSON ERROR: Bool: Expected 'true' or 'false', found '") + str.substr(offset, 5) + "'");
      }
    }